

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase1325::run(TestCase1325 *this)

{
  StructDataBitCount *this_00;
  bool bVar1;
  uint64_t uVar2;
  uint64_t local_178;
  int local_170;
  bool local_169;
  bool _kj_shouldLog;
  Fault f;
  Builder root_1;
  undefined1 local_128 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase1325 *this_local;
  
  this_00 = &root._builder.dataSize;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)this_00,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestOldUnionVersion>
            ((Builder *)local_128,(MessageBuilder *)this_00);
  capnproto_test::capnp::test::TestOldUnionVersion::Builder::setB((Builder *)local_128,0x7b);
  MessageBuilder::getRoot<capnproto_test::capnp::test::TestNewUnionVersion>
            ((Builder *)&f,(MessageBuilder *)&root._builder.dataSize);
  bVar1 = capnproto_test::capnp::test::TestNewUnionVersion::Builder::isB((Builder *)&f);
  if (bVar1) {
    MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root._builder.dataSize);
    return;
  }
  kj::_::Debug::Fault::Fault
            ((Fault *)&stack0xfffffffffffffe98,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
             ,0x538,FAILED,"root.isB()","");
  uVar2 = capnproto_test::capnp::test::TestNewUnionVersion::Builder::getB((Builder *)&f);
  if (uVar2 != 0x7b) {
    local_169 = kj::_::Debug::shouldLog(ERROR);
    while (local_169 != false) {
      local_170 = 0x7b;
      local_178 = capnproto_test::capnp::test::TestNewUnionVersion::Builder::getB((Builder *)&f);
      kj::_::Debug::log<char_const(&)[40],int,unsigned_long>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/encoding-test.c++"
                 ,0x539,ERROR,"\"failed: expected \" \"(123) == (root.getB())\", 123, root.getB()",
                 (char (*) [40])"failed: expected (123) == (root.getB())",&local_170,&local_178);
      local_169 = false;
    }
  }
  kj::_::Debug::Fault::fatal((Fault *)&stack0xfffffffffffffe98);
}

Assistant:

TEST(Encoding, UpgradeUnion) {
  // This tests for a specific case that was broken originally.
  MallocMessageBuilder builder;

  {
    auto root = builder.getRoot<test::TestOldUnionVersion>();
    root.setB(123);
  }

  {
    auto root = builder.getRoot<test::TestNewUnionVersion>();
    ASSERT_TRUE(root.isB())
    EXPECT_EQ(123, root.getB());
  }
}